

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  pointer *pppcVar1;
  pointer *pppcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  char *pcVar5;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  string *__x;
  pointer ppcVar7;
  pointer source;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string local_58;
  string *local_38;
  
  pcVar3 = this->Makefile;
  pppcVar2 = &headerSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&headerSources,"CMAKE_BUILD_TYPE","");
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&headerSources);
  std::__cxx11::string::string((string *)&local_58,pcVar5,(allocator *)&extraSources);
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  pcVar3 = this->Makefile;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&headerSources,"ADDITIONAL_MAKE_CLEAN_FILES","");
  pcVar5 = cmMakefile::GetProperty(pcVar3,(string *)&headerSources);
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (pcVar5 != (char *)0x0) {
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&customCommands,(cmListFileBacktrace *)0x0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&headerSources,(char *)&customCommands);
    externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         headerSources.
         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&headerSources);
    pppcVar1 = &extraSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)extraSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar1;
    pcVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        externalObjects.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,this->Makefile,&local_58,false,
                        this->Target,(cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&extraSources);
    std::__cxx11::string::string((string *)&headerSources,pcVar5,(allocator *)&objectSources);
    cmSystemTools::ExpandListArgument((string *)&headerSources,&this->CleanFiles,false);
    if (headerSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar2) {
      operator_delete(headerSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)headerSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar1) {
      operator_delete(extraSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)extraSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&externalObjects);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&customCommands);
  }
  pcVar3 = this->Makefile;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&headerSources,"CLEAN_NO_CUSTOM","");
  pcVar5 = cmMakefile::GetProperty(pcVar3,(string *)&headerSources);
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar4 = cmSystemTools::IsOff(pcVar5);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands(this->GeneratorTarget,&customCommands,&local_58);
  if (customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_38 = &this->ConfigName;
    ppcVar7 = customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      cc = cmSourceFile::GetCustomCommand(*ppcVar7);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&headerSources,cc,local_38,this->Makefile);
      GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)&headerSources);
      if (bVar4) {
        pvVar6 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                           ((cmCustomCommandGenerator *)&headerSources);
        for (source = (pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            source != (pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
          cmOutputConverter::Convert
                    ((string *)&extraSources,
                     &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,source,
                     START_OUTPUT,UNCHANGED);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CleanFiles,(string *)&extraSources);
          if (extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&extraSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(extraSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)extraSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&headerSources);
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 !=
             customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources(this->GeneratorTarget,&headerSources,&local_58);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,&headerSources,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources(this->GeneratorTarget,&extraSources,&local_58);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,&extraSources,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects(this->GeneratorTarget,&externalObjects,&local_58);
  if (externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar7 = externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      __x = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ExternalObjects,__x);
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 !=
             externalObjects.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources(this->GeneratorTarget,&objectSources,&local_58);
  for (ppcVar7 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar7 !=
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    WriteObjectRuleFiles(this,*ppcVar7);
  }
  if (objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(objectSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(externalObjects.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)externalObjects.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)externalObjects.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(extraSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)extraSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)extraSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(customCommands.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)customCommands.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)customCommands.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if(const char* additional_clean_files =
     this->Makefile->GetProperty
     ("ADDITIONAL_MAKE_CLEAN_FILES"))
    {
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                                            ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(cge->Evaluate(this->Makefile, config,
                                                  false, this->Target, 0, 0),
                                      this->CleanFiles);
    }

  // add custom commands to the clean rules?
  const char* clean_no_custom =
    this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = customCommands.begin();
      si != customCommands.end(); ++si)
    {
    cmCustomCommandGenerator ccg(*(*si)->GetCustomCommand(),
                                 this->ConfigName,
                                 this->Makefile);
    this->GenerateCustomRuleFile(ccg);
    if (clean)
      {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for(std::vector<std::string>::const_iterator o = outputs.begin();
          o != outputs.end(); ++o)
        {
        this->CleanFiles.push_back
          (this->Convert(*o,
                         cmLocalGenerator::START_OUTPUT,
                         cmLocalGenerator::UNCHANGED));
        }
      }
    }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources,
    this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources,
    this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = externalObjects.begin();
      si != externalObjects.end(); ++si)
    {
    this->ExternalObjects.push_back((*si)->GetFullPath());
    }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for(std::vector<cmSourceFile const*>::const_iterator
        si = objectSources.begin(); si != objectSources.end(); ++si)
    {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(**si);
    }
}